

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player.cpp
# Opt level: O0

void __thiscall relive::Player::~Player(Player *this)

{
  pointer piVar1;
  Player *this_local;
  
  this->_vptr_Player = (_func_int **)&PTR__Player_00362c60;
  piVar1 = std::unique_ptr<relive::Player::impl,_std::default_delete<relive::Player::impl>_>::
           operator->(&this->_impl);
  std::atomic<bool>::operator=(&piVar1->_isRunning,false);
  std::unique_ptr<relive::Player::impl,_std::default_delete<relive::Player::impl>_>::operator->
            (&this->_impl);
  std::thread::join();
  disableAudio(this);
  piVar1 = std::unique_ptr<relive::Player::impl,_std::default_delete<relive::Player::impl>_>::
           operator->(&this->_impl);
  ma_context_uninit(&piVar1->_maContext);
  std::unique_ptr<relive::Player::impl,_std::default_delete<relive::Player::impl>_>::~unique_ptr
            (&this->_impl);
  return;
}

Assistant:

Player::~Player()
{
    _impl->_isRunning = false;
    _impl->_worker.join();
    disableAudio();
    ma_context_uninit(&_impl->_maContext);
}